

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *__s;
  
  iVar5 = 0x32;
  if (1 < (ulong)((long)end - (long)*src)) {
    puVar3 = *src;
    lVar7 = 0;
    puVar10 = (uint8_t *)0x0;
    do {
      uVar9 = (long)puVar10 * 0x100;
      *src = puVar3 + lVar7 + 1;
      uVar11 = (ulong)puVar3[lVar7];
      puVar10 = (uint8_t *)(uVar11 + uVar9);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
    iVar5 = 0x32;
    if (puVar10 <= end + (-2 - (long)puVar3)) {
      uVar9 = uVar9 | uVar11;
      do {
        puVar10 = *src;
        if (puVar3 + uVar9 + 2 == puVar10) {
          iVar5 = 0x32;
LAB_0012886d:
          bVar4 = false;
        }
        else {
          *src = puVar10 + 1;
          uVar1 = *puVar10;
          iVar5 = 0x32;
          if (puVar3 + (uVar9 - (long)*src) + 2 < (uint8_t *)0x2) goto LAB_0012886d;
          puVar8 = puVar3 + (uVar9 - (long)*src) + 2;
          lVar7 = -2;
          puVar10 = (uint8_t *)0x0;
          pbVar12 = *src;
          do {
            uVar11 = (long)puVar10 * 0x100;
            __s = pbVar12 + 1;
            *src = __s;
            bVar2 = *pbVar12;
            puVar10 = (uint8_t *)(uVar11 + bVar2);
            puVar8 = puVar8 + -1;
            lVar7 = lVar7 + 1;
            pbVar12 = __s;
          } while (lVar7 != 0);
          if (puVar8 < puVar10) goto LAB_0012886d;
          if (uVar1 == '\0') {
            pvVar6 = memchr(__s,0,(size_t)puVar10);
            if (pvVar6 != (void *)0x0) {
              iVar5 = 0x2f;
              goto LAB_0012886d;
            }
            name->base = __s;
            name->len = (size_t)puVar10;
          }
          *src = __s + (uVar11 | bVar2);
          iVar5 = 0;
          bVar4 = true;
        }
      } while ((bVar4) && (puVar3 + uVar9 + 2 != *src));
    }
  }
  return iVar5;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        do {
            uint8_t type;
            if ((ret = ptls_decode8(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}